

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

undefined4 testing::internal::BuiltInDefaultValue<TestCallExprBuilder>::Get(void)

{
  undefined4 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *msg;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  _Alloc_hider in_stack_ffffffffffffffd7;
  string local_28 [24];
  allocator<char> *in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  msg = (string *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             in_stack_fffffffffffffff0);
  Assert((bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,msg);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  uVar1 = Invalid<TestCallExprBuilder>();
  return uVar1;
}

Assistant:

static T Get() {
    Assert(false, __FILE__, __LINE__,
           "Default action undefined for the function return type.");
    return internal::Invalid<T>();
    // The above statement will never be reached, but is required in
    // order for this function to compile.
  }